

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmap.c
# Opt level: O2

void cmap_set_game_charset(errcxdef *ec,char *internal_id,char *internal_ldesc,char *argv0)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char filename [4096];
  char acStack_1018 [4096];
  
  if (S_cmap_loaded == '\0') {
    os_gen_charmap_filename(acStack_1018,internal_id,argv0);
    iVar1 = cmap_load_internal(acStack_1018);
    if (iVar1 != 0) {
      sVar2 = strlen(acStack_1018);
      pcVar3 = errstr(ec,acStack_1018,(int)sVar2);
      ec->errcxptr->erraav[0].errastr = pcVar3;
      sVar2 = strlen(internal_ldesc);
      pcVar3 = errstr(ec,internal_ldesc,(int)sVar2);
      ec->errcxptr->erraav[1].errastr = pcVar3;
      ec->errcxptr->erraac = 2;
      errsign(ec,700,"TADS");
    }
    strcpy(G_cmap_ldesc,internal_ldesc);
  }
  return;
}

Assistant:

void cmap_set_game_charset(errcxdef *ec,
                           char *internal_id, char *internal_ldesc,
                           char *argv0)
{
    char filename[OSFNMAX];
    
    /* 
     *   If a character set is already explicitly loaded, ignore the
     *   game's character set - the player asked us to use a particular
     *   mapping, so ignore what the game wants.  (This will probably
     *   result in incorrect display of non-ASCII character values, but
     *   the player is most likely to use this to avoid errors when an
     *   appropriate mapping file for the game is not available.  In this
     *   case, the player informs us by setting the option that he or she
     *   knows and accepts that the game will not look exactly right.)  
     */
    if (S_cmap_loaded)
        return;

    /* 
     *   ask the operating system to name the mapping file -- this routine
     *   will determine, if possible, the current native character set,
     *   and apply a system-specific naming convention to tell us what
     *   mapping file we should open 
     */
    os_gen_charmap_filename(filename, internal_id, argv0);

    /* try loading the mapping file */
    if (cmap_load_internal(filename))
        errsig2(ec, ERR_CHRNOFILE,
                ERRTSTR, errstr(ec, filename, strlen(filename)),
                ERRTSTR, errstr(ec, internal_ldesc, strlen(internal_ldesc)));

    /*
     *   We were successful - the game's internal character set is now
     *   mapped to the current native character set.  Even though we
     *   loaded an ldesc from the mapping file, forget that and store the
     *   internal ldesc that the game specified.  The reason we do this is
     *   that it's possible that the player will dynamically switch native
     *   character sets in the future, at which point we'll need to
     *   re-load the mapping table, which could raise an error if a
     *   mapping file for the new character set isn't available.  So, we
     *   may need to provide the same explanation later that we needed to
     *   provide here.  Save the game's character set ldesc for that
     *   eventuality, since it describes exactly what the *game* wanted.  
     */
    strcpy(G_cmap_ldesc, internal_ldesc);
}